

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O0

atomic_counter_t * __thiscall zmq::msg_t::refcnt(msg_t *this)

{
  long in_RDI;
  atomic_counter_t *local_8;
  
  if (*(char *)(in_RDI + 0x2a) == 'f') {
    local_8 = (atomic_counter_t *)(*(long *)(in_RDI + 8) + 0x20);
  }
  else if (*(char *)(in_RDI + 0x2a) == 'i') {
    local_8 = (atomic_counter_t *)(*(long *)(in_RDI + 8) + 0x20);
  }
  else {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","false",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x2d2);
    fflush(_stderr);
    zmq_abort((char *)0x2b81ce);
    local_8 = (atomic_counter_t *)0x0;
  }
  return local_8;
}

Assistant:

zmq::atomic_counter_t *zmq::msg_t::refcnt ()
{
    switch (_u.base.type) {
        case type_lmsg:
            return &_u.lmsg.content->refcnt;
        case type_zclmsg:
            return &_u.zclmsg.content->refcnt;
        default:
            zmq_assert (false);
            return NULL;
    }
}